

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[9],QByteArray&>,char>
          (QByteArray *a,QStringBuilder<QStringBuilder<const_char_(&)[9],_QByteArray_&>,_char> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  char cVar2;
  QByteArray *pQVar3;
  size_t __n;
  ulong uVar4;
  char *pcVar5;
  Data *pDVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char *__dest;
  ulong uVar10;
  
  pDVar6 = (a->d).d;
  uVar8 = (a->d).size;
  uVar10 = uVar8 + (((b->a).b)->d).size + 9;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar8);
    pDVar6 = (a->d).d;
    uVar8 = (a->d).size;
    uVar4 = uVar10;
    if (pDVar6 != (Data *)0x0) goto LAB_001ab653;
LAB_001ab690:
    if (uVar4 < uVar8) {
      uVar4 = uVar8;
    }
    QByteArray::reallocData((longlong)a,(AllocationOption)uVar4);
    pDVar6 = (a->d).d;
    if (pDVar6 != (Data *)0x0) {
      lVar7 = (pDVar6->super_QArrayData).alloc;
LAB_001ab6b3:
      if (lVar7 != 0) {
        pAVar1 = &(pDVar6->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      goto LAB_001ab6bc;
    }
  }
  else {
LAB_001ab653:
    lVar7 = (pDVar6->super_QArrayData).alloc;
    pcVar5 = (a->d).ptr;
    lVar9 = ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar7;
    if ((long)((lVar9 - uVar8) - (long)pcVar5) < (long)uVar10) {
      uVar4 = lVar7 * 2;
      if (lVar7 * 2 < (long)uVar10) {
        uVar4 = uVar10;
      }
      if ((1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar9 - (long)pcVar5 < (long)uVar4)) goto LAB_001ab690;
      goto LAB_001ab6b3;
    }
LAB_001ab6bc:
    if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001ab6d4;
  }
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001ab6d4:
  __dest = (a->d).ptr + (a->d).size;
  pcVar5 = *(b->a).a;
  cVar2 = *pcVar5;
  while (cVar2 != '\0') {
    pcVar5 = pcVar5 + 1;
    *__dest = cVar2;
    __dest = __dest + 1;
    cVar2 = *pcVar5;
  }
  pQVar3 = (b->a).b;
  __n = (pQVar3->d).size;
  if (__n != 0) {
    memcpy(__dest,(pQVar3->d).ptr,__n);
  }
  __dest[__n] = b->b;
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}